

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alaw.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  string *this;
  _Alloc_hider _Var6;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  int iVar8;
  double compression_factor;
  double abs_max_value;
  double data;
  ALawCompression a_law_compression;
  ostringstream error_message_4;
  ifstream ifs;
  double local_410;
  double local_408;
  string local_400;
  double local_3e0;
  undefined1 local_3d8 [32];
  bool local_3b8;
  string local_3b0 [3];
  ios_base local_340 [264];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_408 = 32768.0;
  local_410 = 87.6;
  iVar8 = 0;
  do {
    iVar4 = ya_getopt_long(argc,argv,"v:a:h",(option *)0x0,(int *)0x0);
    if (iVar4 < 0x68) {
      if (iVar4 == -1) {
        iVar4 = 2;
      }
      else {
        if (iVar4 != 0x61) {
LAB_0010385d:
          anon_unknown.dwarf_1ebc::PrintUsage((ostream *)&std::cerr);
          goto LAB_0010390f;
        }
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
        bVar1 = sptk::ConvertStringToDouble(&local_238,&local_410);
        bVar2 = local_410 < 1.0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (!bVar1 || bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_238,"The argument for the -a option must be a number ",0x30);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_238,"greater than or equal to one",0x1c);
          local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"alaw","");
          sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
          goto LAB_001038e4;
        }
LAB_0010384f:
        iVar4 = 0;
      }
    }
    else if (iVar4 == 0x68) {
      anon_unknown.dwarf_1ebc::PrintUsage((ostream *)&std::cout);
      iVar8 = 0;
      iVar4 = 1;
    }
    else {
      if (iVar4 != 0x76) goto LAB_0010385d;
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
      bVar1 = sptk::ConvertStringToDouble(&local_238,&local_408);
      bVar2 = 0.0 < local_408;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (bVar1 && bVar2) goto LAB_0010384f;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -v option must be a positive number",
                 0x38);
      local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"alaw","");
      sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
LAB_001038e4:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
LAB_0010390f:
      iVar4 = 1;
      iVar8 = 1;
    }
  } while (iVar4 == 0);
  if (iVar4 != 2) {
    return iVar8;
  }
  if (argc - ya_optind < 2) {
    if (argc == ya_optind) {
      __s = (char *)0x0;
    }
    else {
      __s = argv[ya_optind];
    }
    bVar2 = sptk::SetBinaryMode();
    this = &local_238;
    if (bVar2) {
      std::ifstream::ifstream(this);
      if ((__s == (char *)0x0) ||
         (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
         (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          this = (string *)&std::cin;
        }
        sptk::ALawCompression::ALawCompression((ALawCompression *)local_3d8,local_408,local_410);
        if (local_3b8 == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b0,"Failed to initialize ALawCompression",0x24);
          local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"alaw","");
          sptk::PrintErrorMessage(&local_400,(ostringstream *)local_3b0);
        }
        else {
          do {
            bVar2 = sptk::ReadStream<double>(&local_3e0,(istream *)this);
            if (!bVar2) {
              iVar8 = 0;
              goto LAB_00103cb9;
            }
            bVar2 = sptk::ALawCompression::Run((ALawCompression *)local_3d8,&local_3e0);
            if (!bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b0,"Failed to compress",0x12);
              local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"alaw","");
              sptk::PrintErrorMessage(&local_400,(ostringstream *)local_3b0);
              goto LAB_00103c86;
            }
            bVar2 = sptk::WriteStream<double>(local_3e0,(ostream *)&std::cout);
          } while (bVar2);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b0,"Failed to write compressed data",0x1f);
          local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"alaw","");
          sptk::PrintErrorMessage(&local_400,(ostringstream *)local_3b0);
        }
LAB_00103c86:
        paVar7 = &local_400.field_2;
        _Var6._M_p = local_400._M_dataplus._M_p;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b0,"Cannot open file ",0x11);
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,__s,sVar5);
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_3d8 + 0x10);
        local_3d8._0_8_ = paVar7;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"alaw","");
        sptk::PrintErrorMessage((string *)local_3d8,(ostringstream *)local_3b0);
        _Var6._M_p = (pointer)local_3d8._0_8_;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != paVar7) {
        operator_delete(_Var6._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
      iVar8 = 1;
LAB_00103cb9:
      std::ifstream::~ifstream(&local_238);
      return iVar8;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"Cannot set translation mode",0x1b);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"alaw","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0[0]._M_dataplus._M_p == &local_3b0[0].field_2) goto LAB_001039a7;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Too many input files",0x14);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"alaw","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0[0]._M_dataplus._M_p == &local_3b0[0].field_2) goto LAB_001039a7;
  }
  operator_delete(local_3b0[0]._M_dataplus._M_p);
LAB_001039a7:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
  std::ios_base::~ios_base(local_1c8);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
  double abs_max_value(kDefaultAbsMaxValue);
  double compression_factor(kDefaultCompressionFactor);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "v:a:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'v': {
        if (!sptk::ConvertStringToDouble(optarg, &abs_max_value) ||
            abs_max_value <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -v option must be a positive number";
          sptk::PrintErrorMessage("alaw", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &compression_factor) ||
            compression_factor < 1.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -a option must be a number "
                        << "greater than or equal to one";
          sptk::PrintErrorMessage("alaw", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("alaw", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("alaw", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("alaw", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::ALawCompression a_law_compression(abs_max_value, compression_factor);
  if (!a_law_compression.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize ALawCompression";
    sptk::PrintErrorMessage("alaw", error_message);
    return 1;
  }

  double data;

  while (sptk::ReadStream(&data, &input_stream)) {
    if (!a_law_compression.Run(&data)) {
      std::ostringstream error_message;
      error_message << "Failed to compress";
      sptk::PrintErrorMessage("alaw", error_message);
      return 1;
    }

    if (!sptk::WriteStream(data, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write compressed data";
      sptk::PrintErrorMessage("alaw", error_message);
      return 1;
    }
  }

  return 0;
}